

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PIT.hpp
# Opt level: O3

void __thiscall
PCCompatible::i8253<false,_PCCompatible::PITObserver>::Channel::write<2>
          (Channel *this,PITObserver *observer,uint8_t value)

{
  bool bVar1;
  LatchMode LVar2;
  ushort uVar3;
  
  LVar2 = this->latch_mode;
  if (LVar2 == LowHigh) {
    bVar1 = this->next_access_high;
    this->next_access_high = (bool)(bVar1 ^ 1);
    if (bVar1 == false) {
      this->reload = (ushort)value | this->reload & 0xff00;
      this->awaiting_reload = true;
      return;
    }
    this->reload = (ushort)value << 8 | this->reload & 0xff;
  }
  else if (LVar2 == HighOnly) {
    *(uint8_t *)((long)&this->reload + 1) = value;
  }
  else if (LVar2 == LowOnly) {
    *(uint8_t *)&this->reload = value;
  }
  this->awaiting_reload = false;
  uVar3 = this->reload;
  if (this->mode == SquareWaveGenerator) {
    uVar3 = uVar3 & 0xfffe;
  }
  this->counter = uVar3;
  return;
}

Assistant:

void write([[maybe_unused]] PITObserver &observer, uint8_t value) {
				switch(latch_mode) {
					case LatchMode::LowOnly:
						reload = (reload & 0xff00) | value;
					break;
					case LatchMode::HighOnly:
						reload = uint16_t((reload & 0x00ff) | (value << 8));
					break;
					case LatchMode::LowHigh:
						next_access_high ^= true;
						if(next_access_high) {
							reload = (reload & 0xff00) | value;
							awaiting_reload = true;
							return;
						}

						reload = uint16_t((reload & 0x00ff) | (value << 8));
					break;
				}

				awaiting_reload = false;

				switch(mode) {
					default:
						counter = reload;
					break;

					case OperatingMode::SquareWaveGenerator:
						counter = reload & ~1;
					break;
				}
			}